

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_write_file(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uchar uVar1;
  int iVar2;
  CVmRun *this_00;
  vm_val_t *this_01;
  vmobjfile_ext_t *pvVar3;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  vm_val_t *argval;
  CVmObjFile *in_stack_00000020;
  vm_val_t *in_stack_00000088;
  CVmObjFile *in_stack_00000090;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  if ((getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_write_file::desc,1);
    __cxa_guard_release(&getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar2 == 0) {
    this_00 = (CVmRun *)CVmStack::get(0);
    this_01 = CVmStack::push();
    vm_val_t::set_obj(this_01,in_ESI);
    check_valid_file((CVmObjFile *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    check_write_access((CVmObjFile *)0x2e0a44);
    switch_read_write_mode((CVmObjFile *)this_00,(int)((ulong)in_RDI >> 0x20));
    pvVar3 = get_ext((CVmObjFile *)in_RDI);
    uVar1 = pvVar3->mode;
    if (uVar1 == '\x01') {
      write_text_mode(in_stack_00000090,in_stack_00000088);
    }
    else if (uVar1 == '\x02') {
      write_data_mode(in_stack_00000020,argval);
    }
    else if (uVar1 == '\x03') {
      CVmRun::throw_new_class
                (this_00,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI,
                 (char *)(ulong)CONCAT14(3,in_stack_ffffffffffffffb0));
    }
    CVmStack::discard(2);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_write_file(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    const vm_val_t *argval;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   get a pointer to the argument value, but leave it on the stack
     *   for now to protect against losing it in garbage collection 
     */
    argval = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* check that we have write access */
    check_write_access(vmg0_);

    /* deal with stdio buffering if we're changing modes */
    switch_read_write_mode(vmg_ TRUE);

    /* read according to our mode */
    switch(get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* read a line of text */
        write_text_mode(vmg_ argval);
        break;

    case VMOBJFILE_MODE_DATA:
        /* read in data mode */
        write_data_mode(vmg_ argval);
        break;

    case VMOBJFILE_MODE_RAW:
        /* can't use this call on this type of file */
        G_interpreter->throw_new_class(vmg_ G_predef->file_mode_exc,
                                       0, "wrong file mode");
        break;
    }

    /* discard our gc protection and argument */
    G_stk->discard(2);

    /* no return value - return nil by default */
    retval->set_nil();
    
    /* handled */
    return TRUE;
}